

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar.h
# Opt level: O2

void __thiscall
bmc::progress_bar::progress_bar
          (progress_bar *this,size_t min,size_t max,size_t width,bool auto_inc,bool show_time)

{
  rep rVar1;
  invalid_argument *this_00;
  code *pcVar2;
  undefined *puVar3;
  
  this->min_ = min;
  this->max_ = max;
  this->current_ = min;
  this->width_ = width;
  this->auto_inc_ = auto_inc;
  this->show_time_ = show_time;
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->timestamp_).__d.__r = rVar1;
  if (this->min_ < this->max_) {
    if (this->width_ != 0) {
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"width cannot be 0% of terminal");
    puVar3 = &std::invalid_argument::typeinfo;
    pcVar2 = std::invalid_argument::~invalid_argument;
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::range_error::range_error((range_error *)this_00,"max must be greater than min");
    puVar3 = &std::range_error::typeinfo;
    pcVar2 = std::range_error::~range_error;
  }
  __cxa_throw(this_00,puVar3,pcVar2);
}

Assistant:

progress_bar(std::size_t min,
               std::size_t max,
               std::size_t width,
               bool        auto_inc,
               bool        show_time)
   : min_(min),
     max_(max),
     current_(min),
     width_(width),
     auto_inc_(auto_inc),
     show_time_(show_time),
     timestamp_(std::chrono::high_resolution_clock::now()) {
    if (max_ <= min_) {
      throw std::range_error("max must be greater than min");
    }
    if (!width_) {
      throw std::invalid_argument("width cannot be 0% of terminal");
    }
  }